

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glob.cpp
# Opt level: O1

void slang::iterDirectoriesRecursive
               (path *path,SmallVector<std::filesystem::__cxx11::path,_2UL> *results,
               flat_hash_set<std::string> *visited)

{
  size_t *psVar1;
  long lVar2;
  pointer ppVar3;
  group_type_pointer pgVar4;
  group_type_pointer pgVar5;
  value_type_pointer pbVar6;
  ulong uVar7;
  uchar uVar8;
  uchar uVar9;
  uchar uVar10;
  uchar uVar11;
  _Alloc_hider __s1;
  size_type __n;
  int iVar12;
  uint64_t hash;
  uint uVar13;
  path *ctx;
  path *pos0;
  path *ppVar14;
  ulong uVar15;
  pointer ppVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  value_type *elements;
  error_code ec;
  path canonical;
  locator res;
  SmallVector<std::filesystem::__cxx11::path,_2UL> local;
  undefined8 *local_168;
  path local_d8;
  locator local_b0;
  SmallVector<std::filesystem::__cxx11::path,_2UL> local_98;
  
  local_98.super_SmallVectorBase<std::filesystem::__cxx11::path>.data_ =
       (pointer)local_98.super_SmallVectorBase<std::filesystem::__cxx11::path>.firstElement;
  local_98.super_SmallVectorBase<std::filesystem::__cxx11::path>.len = 0;
  local_98.super_SmallVectorBase<std::filesystem::__cxx11::path>.cap = 2;
  iterDirectory(path,&local_98,Directories);
  ctx = (path *)(local_98.super_SmallVectorBase<std::filesystem::__cxx11::path>.len +
                (results->super_SmallVectorBase<std::filesystem::__cxx11::path>).len);
  SmallVectorBase<std::filesystem::__cxx11::path>::reserve
            (&results->super_SmallVectorBase<std::filesystem::__cxx11::path>,(size_type)ctx);
  ppVar16 = local_98.super_SmallVectorBase<std::filesystem::__cxx11::path>.data_;
  if (local_98.super_SmallVectorBase<std::filesystem::__cxx11::path>.len != 0) {
    ppVar3 = local_98.super_SmallVectorBase<std::filesystem::__cxx11::path>.data_ +
             local_98.super_SmallVectorBase<std::filesystem::__cxx11::path>.len;
    std::_V2::system_category();
    do {
      std::filesystem::weakly_canonical(&local_d8,(error_code *)ppVar16);
      hash = hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
             ::operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                           *)visited,&local_d8._M_pathname);
      __n = local_d8._M_pathname._M_string_length;
      __s1._M_p = local_d8._M_pathname._M_dataplus._M_p;
      pos0 = (path *)(hash >> ((byte)(visited->table_).
                                     super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::__cxx11::basic_string<char>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::__cxx11::basic_string<char>_>_>
                                     .arrays.groups_size_index & 0x3f));
      pgVar5 = (visited->table_).
               super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::__cxx11::basic_string<char>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::__cxx11::basic_string<char>_>_>
               .arrays.groups_;
      lVar2 = (hash & 0xff) * 4;
      uVar8 = (&UNK_0051605c)[lVar2];
      uVar9 = (&UNK_0051605d)[lVar2];
      uVar10 = (&UNK_0051605e)[lVar2];
      uVar11 = (&UNK_0051605f)[lVar2];
      pbVar6 = (visited->table_).
               super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::__cxx11::basic_string<char>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::__cxx11::basic_string<char>_>_>
               .arrays.elements_;
      uVar7 = (visited->table_).
              super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::__cxx11::basic_string<char>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::__cxx11::basic_string<char>_>_>
              .arrays.groups_size_mask;
      uVar15 = 0;
      ppVar14 = pos0;
      do {
        pgVar4 = pgVar5 + (long)ppVar14;
        auVar18[0] = -(pgVar4->m[0].n == uVar8);
        auVar18[1] = -(pgVar4->m[1].n == uVar9);
        auVar18[2] = -(pgVar4->m[2].n == uVar10);
        auVar18[3] = -(pgVar4->m[3].n == uVar11);
        auVar18[4] = -(pgVar4->m[4].n == uVar8);
        auVar18[5] = -(pgVar4->m[5].n == uVar9);
        auVar18[6] = -(pgVar4->m[6].n == uVar10);
        auVar18[7] = -(pgVar4->m[7].n == uVar11);
        auVar18[8] = -(pgVar4->m[8].n == uVar8);
        auVar18[9] = -(pgVar4->m[9].n == uVar9);
        auVar18[10] = -(pgVar4->m[10].n == uVar10);
        auVar18[0xb] = -(pgVar4->m[0xb].n == uVar11);
        auVar18[0xc] = -(pgVar4->m[0xc].n == uVar8);
        auVar18[0xd] = -(pgVar4->m[0xd].n == uVar9);
        auVar18[0xe] = -(pgVar4->m[0xe].n == uVar10);
        auVar18[0xf] = -(pgVar4->m[0xf].n == uVar11);
        ctx = ppVar14;
        for (uVar13 = (uint)(ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                                     (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                                     (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                                     (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                                     (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                                     (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                                     (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                                     (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                                     (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                                     (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                                     (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                                     (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                                     (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                                     (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                                    (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe); uVar13 != 0;
            uVar13 = uVar13 - 1 & uVar13) {
          iVar12 = 0;
          if (uVar13 != 0) {
            for (; (uVar13 >> iVar12 & 1) == 0; iVar12 = iVar12 + 1) {
            }
          }
          bVar17 = __n == *(size_t *)
                           ((long)&pbVar6[(long)ppVar14 * 0xf]._M_string_length +
                           (ulong)(uint)(iVar12 << 5));
          local_168 = (undefined8 *)
                      ((long)&pbVar6[(long)ppVar14 * 0xf]._M_dataplus._M_p +
                      (ulong)(uint)(iVar12 << 5));
          ctx = (path *)CONCAT71((int7)((ulong)ctx >> 8),!bVar17 || __n == 0);
          if (bVar17 && __n != 0) {
            ctx = (path *)*local_168;
            iVar12 = bcmp(__s1._M_p,ctx,__n);
            bVar17 = iVar12 == 0;
          }
          if (bVar17) goto LAB_002a1f46;
        }
        ctx = (path *)(pgVar5 + (long)ppVar14);
        if ((((slot_type *)((long)&(ctx->_M_pathname)._M_string_length + 7))->n &
            (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7]) == 0) break;
        lVar2 = uVar15 + 1;
        uVar15 = uVar15 + 1;
        ppVar14 = (path *)((ulong)((long)&(ppVar14->_M_pathname)._M_dataplus._M_p + lVar2) & uVar7);
        ctx = ppVar14;
      } while (uVar15 <= uVar7);
      local_168 = (undefined8 *)0x0;
LAB_002a1f46:
      ppVar14 = &local_d8;
      if (local_168 == (undefined8 *)0x0) {
        if ((visited->table_).
            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::__cxx11::basic_string<char>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::__cxx11::basic_string<char>_>_>
            .size_ctrl.size <
            (visited->table_).
            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::__cxx11::basic_string<char>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::__cxx11::basic_string<char>_>_>
            .size_ctrl.ml) {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<std::__cxx11::string>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::nosize_unchecked_emplace_at<std::__cxx11::string_const&>
                    (&local_b0,
                     (table_core<boost::unordered::detail::foa::flat_set_types<std::__cxx11::string>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)visited,(arrays_type *)visited,(size_t)pos0,hash,&ppVar14->_M_pathname);
          psVar1 = &(visited->table_).
                    super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::__cxx11::basic_string<char>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::__cxx11::basic_string<char>_>_>
                    .size_ctrl.size;
          *psVar1 = *psVar1 + 1;
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<std::__cxx11::string>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::unchecked_emplace_with_rehash<std::__cxx11::string_const&>
                    (&local_b0,
                     (table_core<boost::unordered::detail::foa::flat_set_types<std::__cxx11::string>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)visited,hash,&ppVar14->_M_pathname);
        }
        iterDirectoriesRecursive(ppVar14,results,visited);
        SmallVectorBase<std::filesystem::__cxx11::path>::
        emplace_back<std::filesystem::__cxx11::path>
                  (&results->super_SmallVectorBase<std::filesystem::__cxx11::path>,ppVar14);
        ctx = ppVar14;
      }
      std::filesystem::__cxx11::path::~path(&local_d8);
      ppVar16 = ppVar16 + 1;
    } while (ppVar16 != ppVar3);
  }
  SmallVectorBase<std::filesystem::__cxx11::path>::cleanup
            (&local_98.super_SmallVectorBase<std::filesystem::__cxx11::path>,(EVP_PKEY_CTX *)ctx);
  return;
}

Assistant:

static void iterDirectoriesRecursive(const fs::path& path, SmallVector<fs::path>& results,
                                     flat_hash_set<std::string>& visited) {
    SmallVector<fs::path> local;
    iterDirectory(path, local, GlobMode::Directories);

    results.reserve(results.size() + local.size());
    for (auto& p : local) {
        // Avoid recursing into directories we've already visited (via symlinks).
        std::error_code ec;
        fs::path canonical = fs::weakly_canonical(p, ec);

        if (!ec && visited.emplace(getU8Str(canonical)).second) {
            iterDirectoriesRecursive(canonical, results, visited);
            results.emplace_back(std::move(canonical));
        }
    }
}